

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

bool __thiscall roaring::Roaring64Map::contains(Roaring64Map *this,uint64_t x)

{
  bool bVar1;
  pointer ppVar2;
  uint64_t in_RSI;
  const_iterator iter;
  undefined4 in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  Roaring *this_00;
  _Self local_30;
  uint32_t local_24;
  _Self local_20;
  uint64_t local_18;
  bool local_1;
  
  local_18 = in_RSI;
  local_24 = highBytes(in_RSI);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
       ::find((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),(key_type *)0x11af85)
  ;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
       ::end((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
              *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  bVar1 = std::operator==(&local_20,&local_30);
  if (bVar1) {
    local_1 = false;
  }
  else {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *
                        )0x11afbf);
    this_00 = &ppVar2->second;
    lowBytes(local_18);
    local_1 = Roaring::contains(this_00,in_stack_ffffffffffffffbc);
  }
  return local_1;
}

Assistant:

bool contains(uint64_t x) const {
        auto iter = roarings.find(highBytes(x));
        if (iter == roarings.end()) {
            return false;
        }
        return iter->second.contains(lowBytes(x));
    }